

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

FunctionData ** __thiscall
DirectChainedMap<FunctionData_*>::find(DirectChainedMap<FunctionData_*> *this,uint hash)

{
  long lVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  lVar1 = (ulong)(this->bucketCount - 1 & hash) * 0x18;
  if (*(long *)(this->data + lVar1 + 0x10) == 0) {
    return (FunctionData **)0x0;
  }
  pNVar2 = this->data + lVar1;
  pNVar3 = pNVar2;
  while( true ) {
    if (pNVar3 == (Node *)0x0) {
      return (FunctionData **)0x0;
    }
    if (*(uint *)pNVar3 == hash) break;
    pNVar3 = *(Node **)(pNVar3 + 0x10);
    if (pNVar3 == pNVar2) {
      return (FunctionData **)0x0;
    }
  }
  return (FunctionData **)(pNVar3 + 8);
}

Assistant:

Value* find(unsigned hash)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = hash & bucketMask;

		Node *start = &data[bucket];
		Node *curr = start;

		if(!curr->next)
			return NULL;

		while(curr)
		{
			if(curr->hash == hash)
				return &curr->value;

			curr = curr->next;

			if(curr == start)
				return NULL;
		}

		return NULL;
	}